

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void AddClassNoIndent(TidyDocImpl *doc,Node *node)

{
  if (*(int *)((doc->config).value + 0xc) == 0) {
    return;
  }
  if (*(int *)((doc->config).value + 0x30) != 0) {
    prvTidyAddStyleAsClass
              (doc,node,"padding-left: 2ex; margin-left: 0ex; margin-top: 0ex; margin-bottom: 0ex");
    return;
  }
  prvTidyAddStyleProperty
            (doc,node,"padding-left: 2ex; margin-left: 0ex; margin-top: 0ex; margin-bottom: 0ex");
  return;
}

Assistant:

static void AddClassNoIndent( TidyDocImpl* doc, Node *node )
{
    ctmbstr sprop =
        "padding-left: 2ex; margin-left: 0ex"
        "; margin-top: 0ex; margin-bottom: 0ex";
    if ( !cfgBool(doc, TidyDecorateInferredUL) )
        return;
    if ( cfgBool(doc, TidyMakeClean) )
        TY_(AddStyleAsClass)( doc, node, sprop );
    else
        TY_(AddStyleProperty)( doc, node, sprop );
}